

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

bool ParseEntryWithoutType(string *entry,string *var,string *value)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  string local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  byte local_2d;
  bool flag;
  string *local_20;
  string *value_local;
  string *var_local;
  string *entry_local;
  
  local_20 = value;
  value_local = var;
  var_local = entry;
  if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
       ::reg == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                   ::reg), iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseEntryWithoutType::reg,"^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseEntryWithoutType::reg,
                 &__dso_handle);
    __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg);
  }
  if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
       ::regQuoted == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                   ::regQuoted), iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseEntryWithoutType::regQuoted,"^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseEntryWithoutType::regQuoted,
                 &__dso_handle);
    __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::regQuoted);
  }
  local_2d = 0;
  bVar2 = cmsys::RegularExpression::find(&ParseEntryWithoutType::regQuoted,var_local);
  if (bVar2) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_50,&ParseEntryWithoutType::regQuoted,1);
    std::__cxx11::string::operator=((string *)value_local,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmsys::RegularExpression::match_abi_cxx11_(&local_70,&ParseEntryWithoutType::regQuoted,2);
    std::__cxx11::string::operator=((string *)local_20,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    local_2d = 1;
  }
  else {
    bVar2 = cmsys::RegularExpression::find(&ParseEntryWithoutType::reg,var_local);
    if (bVar2) {
      cmsys::RegularExpression::match_abi_cxx11_(&local_90,&ParseEntryWithoutType::reg,1);
      std::__cxx11::string::operator=((string *)value_local,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      cmsys::RegularExpression::match_abi_cxx11_(&local_b0,&ParseEntryWithoutType::reg,2);
      std::__cxx11::string::operator=((string *)local_20,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      local_2d = 1;
    }
  }
  if ((((local_2d & 1) != 0) && (uVar4 = std::__cxx11::string::size(), 1 < uVar4)) &&
     (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_20), psVar1 = local_20,
     *pcVar5 == '\'')) {
    std::__cxx11::string::size();
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
    psVar1 = local_20;
    if (*pcVar5 == '\'') {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_d0,(ulong)psVar1);
      std::__cxx11::string::operator=((string *)local_20,local_d0);
      std::__cxx11::string::~string(local_d0);
    }
  }
  return (bool)(local_2d & 1);
}

Assistant:

static bool ParseEntryWithoutType(const std::string& entry,
                                  std::string& var,
                                  std::string& value)
{
  // input line is:         key=value
  static cmsys::RegularExpression reg(
    "^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key"=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if(regQuoted.find(entry))
    {
    var = regQuoted.match(1);
    value = regQuoted.match(2);
    flag = true;
    }
  else if (reg.find(entry))
    {
    var = reg.match(1);
    value = reg.match(2);
    flag = true;
    }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag &&
      value.size() >= 2 &&
      value[0] == '\'' &&
      value[value.size() - 1] == '\'')
    {
    value = value.substr(1,
                         value.size() - 2);
    }

  return flag;
}